

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinSelectWithFilterExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinSelectWithFilterExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,BinsSelectExpressionSyntax *args,Token *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4,MatchesClauseSyntax **args_5)

{
  MatchesClauseSyntax *pMVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  BinSelectWithFilterExprSyntax *pBVar17;
  
  pBVar17 = (BinSelectWithFilterExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((BinSelectWithFilterExprSyntax *)this->endPtr < pBVar17 + 1) {
    pBVar17 = (BinSelectWithFilterExprSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pBVar17 + 1);
  }
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar13 = args_4->kind;
  uVar14 = args_4->field_0x2;
  NVar15.raw = (args_4->numFlags).raw;
  uVar16 = args_4->rawLen;
  pIVar4 = args_4->info;
  pMVar1 = *args_5;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind = BinSelectWithFilterExpr;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pBVar17->expr).ptr = args;
  (pBVar17->with).kind = TVar5;
  (pBVar17->with).field_0x2 = uVar6;
  (pBVar17->with).numFlags = (NumericTokenFlags)NVar7.raw;
  (pBVar17->with).rawLen = uVar8;
  (pBVar17->with).info = pIVar2;
  (pBVar17->openParen).kind = TVar9;
  (pBVar17->openParen).field_0x2 = uVar10;
  (pBVar17->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pBVar17->openParen).rawLen = uVar12;
  (pBVar17->openParen).info = pIVar3;
  (pBVar17->filter).ptr = args_3;
  (pBVar17->closeParen).kind = TVar13;
  (pBVar17->closeParen).field_0x2 = uVar14;
  (pBVar17->closeParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pBVar17->closeParen).rawLen = uVar16;
  (pBVar17->closeParen).info = pIVar4;
  pBVar17->matchesClause = pMVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pBVar17;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pBVar17;
  if (pMVar1 != (MatchesClauseSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = (SyntaxNode *)pBVar17;
  }
  return pBVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }